

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkage.c
# Opt level: O0

void resolve_function_linkage
               (Scope *scope,Translation_Data *translation_data,Denoted_Function *denoted_function)

{
  void *pvVar1;
  Denoted_Function *denoted_function_local;
  Translation_Data *translation_data_local;
  Scope *scope_local;
  
  if (scope->type == BLOCK_SCOPE) {
    if (denoted_function->linkage == LINKAGE_INTERNAL) {
      push_translation_error
                ("static storage class specifier on function declaration in block scope",
                 translation_data);
      return;
    }
    denoted_function->linkage = LINKAGE_EXTERNAL;
    account_for_upper_linkage_on_function(scope,translation_data,denoted_function);
  }
  else {
    if (scope->type != FILE_SCOPE) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/GTSimeonov[P]IOPL_Project/src/semantics/identifiers/linkage.c"
                    ,0x8f,
                    "void resolve_function_linkage(struct Scope *, struct Translation_Data *, struct Denoted_Function *)"
                   );
    }
    if (denoted_function->linkage == LINKAGE_NONE) {
      denoted_function->linkage = LINKAGE_EXTERNAL;
    }
    if (denoted_function->linkage == LINKAGE_EXTERNAL) {
      account_for_upper_linkage_on_function(scope,translation_data,denoted_function);
    }
  }
  if ((denoted_function->linkage == LINKAGE_EXTERNAL) &&
     (pvVar1 = Map_Check(&translation_data->internal_linkage->ids,denoted_function->id->data,
                         denoted_function->id->data_size), pvVar1 != (void *)0x0)) {
    push_translation_error("linking id both internally and externally",translation_data);
  }
  else if ((denoted_function->linkage == LINKAGE_INTERNAL) &&
          (pvVar1 = Map_Check(&translation_data->external_linkage->ids,denoted_function->id->data,
                              denoted_function->id->data_size), pvVar1 != (void *)0x0)) {
    push_translation_error("linking id both internally and externally",translation_data);
  }
  return;
}

Assistant:

void resolve_function_linkage(struct Scope *scope,struct Translation_Data *translation_data,struct Denoted_Function *denoted_function)
{
	if(scope->type==BLOCK_SCOPE)
	{
		if(denoted_function->linkage==LINKAGE_INTERNAL)
		{
			push_translation_error("static storage class specifier on function declaration in block scope",translation_data);
			return;
		}else
		{
			denoted_function->linkage=LINKAGE_EXTERNAL;
			account_for_upper_linkage_on_function(scope,translation_data,denoted_function);

		}
	}else if(scope->type==FILE_SCOPE)
	{
		if(denoted_function->linkage==LINKAGE_NONE)
			denoted_function->linkage=LINKAGE_EXTERNAL;
		/*falltrough*/

		if(denoted_function->linkage==LINKAGE_EXTERNAL)
			account_for_upper_linkage_on_function(scope,translation_data,denoted_function);

	}else
	{
		assert(0);
	}

	/*check if id is linked oppositely*/
	if(denoted_function->linkage==LINKAGE_EXTERNAL &&
		Map_Check(&translation_data->internal_linkage->ids,denoted_function->id->data,denoted_function->id->data_size)!=NULL)
	{
		push_translation_error("linking id both internally and externally",translation_data);
	}else if(denoted_function->linkage==LINKAGE_INTERNAL &&
		Map_Check(&translation_data->external_linkage->ids,denoted_function->id->data,denoted_function->id->data_size)!=NULL)
	{
		push_translation_error("linking id both internally and externally",translation_data);
	}

}